

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O3

int use_candle(obj **optr)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  obj *obj;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  obj *obj_00;
  char *pcVar7;
  char qbuf [128];
  char local_b8 [136];
  
  obj_00 = *optr;
  pcVar7 = "candles";
  if (obj_00->quan == 1) {
    pcVar7 = "candle";
  }
  if ((u._1052_1_ & 1) == 0) {
    obj = carrying(0x10b);
    if ((obj == (obj *)0x0) || (obj->spe == '\a')) {
      if ((u._1052_1_ & 2) == 0) {
        iVar2 = use_lamp(obj_00);
        return iVar2;
      }
    }
    else {
      pcVar4 = xname(obj_00);
      pcVar4 = the(pcVar4);
      sprintf(local_b8,"Attach %s",pcVar4);
      pcVar4 = eos(local_b8);
      pcVar5 = xname(obj);
      pcVar5 = the(pcVar5);
      pcVar6 = simple_typename((int)obj->otyp);
      pcVar6 = the(pcVar6);
      pcVar5 = safe_qbuf(local_b8,6,pcVar5,pcVar6,"it");
      sprintf(pcVar4," to %s?",pcVar5);
      cVar1 = yn_function(local_b8,"yn",'n');
      if (cVar1 != 'n') {
        cVar1 = obj->spe;
        uVar3 = obj_00->quan;
        if ((long)cVar1 + (long)(int)uVar3 < 8) {
          *optr = (obj *)0x0;
        }
        else {
          obj_00 = splitobj(obj_00,7 - (long)cVar1);
          uVar3 = obj_00->quan;
          cVar1 = obj->spe;
        }
        pcVar4 = " more";
        if (cVar1 == '\0') {
          pcVar4 = "";
        }
        pcVar5 = xname(obj);
        pcVar5 = the(pcVar5);
        pline("You attach %ld%s %s to %s.",(ulong)uVar3,pcVar4,pcVar7,pcVar5);
        if (obj->spe == '\0') {
          iVar2 = obj_00->age;
        }
        else {
          iVar2 = obj_00->age;
          if (obj->age <= iVar2) goto LAB_00147d23;
        }
        obj->age = iVar2;
LAB_00147d23:
        iVar2 = obj_00->quan;
        obj->spe = obj->spe + (char)iVar2;
        if ((obj->field_0x4c & 8) == 0) {
          if ((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) != 0) {
            pcVar7 = "It goes";
            if (1 < iVar2) {
              pcVar7 = "They go";
            }
            pline("%s out.",pcVar7);
          }
        }
        else if ((*(uint *)&obj_00->field_0x4a >> 0x13 & 1) == 0) {
          pcVar4 = vtense(pcVar7,"ignite");
          pline("The new %s magically %s!",pcVar7,pcVar4);
        }
        iVar2 = obj_00->quan;
        if ((obj_00->field_0x4a & 4) != 0) {
          pcVar7 = "burn";
          if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) == 0) {
            pcVar7 = "use";
          }
          pcVar4 = "it";
          if (1 < iVar2) {
            pcVar4 = "them";
          }
          verbalize("You %s %s, you bought %s!",pcVar7,pcVar4);
          iVar2 = obj_00->quan;
        }
        if ((iVar2 < 7) && (obj->spe == '\a')) {
          pcVar7 = xname(obj);
          pcVar7 = The(pcVar7);
          pcVar4 = " lit";
          if ((*(uint *)&obj->field_0x4a >> 0x13 & 1) == 0) {
            pcVar4 = "";
          }
          pline("%s now has seven%s candles attached.",pcVar7,pcVar4);
        }
        if ((obj->field_0x4c & 8) != 0) {
          obj_merge_light_sources(obj,obj);
        }
        if ((obj_00->field_0x4c & 8) != 0) {
          end_burn(obj_00,'\x01');
        }
        useupall(obj_00);
        uVar3 = weight(obj);
        obj->owt = uVar3;
        return 1;
      }
      if ((u._1052_1_ & 2) == 0) {
        if ((obj_00->field_0x4c & 8) == 0) {
          pcVar7 = xname(obj_00);
          pcVar7 = the(pcVar7);
          pline("You try to light %s...",pcVar7);
        }
        iVar2 = use_lamp(obj_00);
        return iVar2;
      }
    }
    pcVar7 = "Sorry, fire and water don\'t mix.";
  }
  else {
    pcVar7 = "You don\'t have enough elbow-room to maneuver.";
  }
  pline(pcVar7);
  return 0;
}

Assistant:

static int use_candle(struct obj **optr)
{
	struct obj *obj = *optr;
	struct obj *otmp;
	const char *s = (obj->quan != 1) ? "candles" : "candle";
	char qbuf[QBUFSZ];

	if (u.uswallow) {
		pline(no_elbow_room);
		return 0;
	}
	
	otmp = carrying(CANDELABRUM_OF_INVOCATION);
	if (!otmp || otmp->spe == 7) {
		if (Underwater) {
		    pline("Sorry, fire and water don't mix.");
		    return 0;
		}
		return use_lamp(obj);
	}

	sprintf(qbuf, "Attach %s", the(xname(obj)));
	sprintf(eos(qbuf), " to %s?",
		safe_qbuf(qbuf, sizeof(" to ?"), the(xname(otmp)),
			the(simple_typename(otmp->otyp)), "it"));
	if (yn(qbuf) == 'n') {
		if (Underwater) {
		    pline("Sorry, fire and water don't mix.");
		    return 0;
		}
		if (!obj->lamplit)
		    pline("You try to light %s...", the(xname(obj)));
		return use_lamp(obj);
	} else {
		if ((long)otmp->spe + obj->quan > 7L)
		    obj = splitobj(obj, 7L - (long)otmp->spe);
		else *optr = 0;
		pline("You attach %ld%s %s to %s.",
		    obj->quan, !otmp->spe ? "" : " more",
		    s, the(xname(otmp)));
		if (!otmp->spe || otmp->age > obj->age)
		    otmp->age = obj->age;
		otmp->spe += (int)obj->quan;
		if (otmp->lamplit && !obj->lamplit)
		    pline("The new %s magically %s!", s, vtense(s, "ignite"));
		else if (!otmp->lamplit && obj->lamplit)
		    pline("%s out.", (obj->quan > 1L) ? "They go" : "It goes");
		if (obj->unpaid)
		    verbalize("You %s %s, you bought %s!",
			      otmp->lamplit ? "burn" : "use",
			      (obj->quan > 1L) ? "them" : "it",
			      (obj->quan > 1L) ? "them" : "it");
		if (obj->quan < 7L && otmp->spe == 7)
		    pline("%s now has seven%s candles attached.",
			  The(xname(otmp)), otmp->lamplit ? " lit" : "");
		/* candelabrum's light range might increase */
		if (otmp->lamplit) obj_merge_light_sources(otmp, otmp);
		/* candles are no longer a separate light source */
		if (obj->lamplit) end_burn(obj, TRUE);
		/* candles are now gone */
		useupall(obj);
		otmp->owt = weight(otmp);
		/* no encumber_msg: weight on player didn't change */
	}
	return 1;
}